

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

bool __thiscall
crnlib::dxt1_endpoint_optimizer::refine_solution(dxt1_endpoint_optimizer *this,int refinement_level)

{
  unique_color *puVar1;
  bool bVar2;
  uchar uVar3;
  bool bVar4;
  uint16 uVar5;
  uint16 uVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  int br;
  unsigned_short __tmp_1;
  undefined2 uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  ulong uVar17;
  int gr;
  int gr_1;
  long lVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  dxt1_solution_coordinates nc;
  dxt1_solution_coordinates nc_1;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_8c;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_88;
  dxt1_solution_coordinates local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  dxt1_endpoint_optimizer *local_58;
  int local_4c;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  if (this->m_evaluate_hc == true) {
    compute_selectors_hc(this);
  }
  uVar9 = (ulong)(this->m_unique_colors).m_size;
  dVar19 = 0.0;
  dVar22 = 0.0;
  dVar23 = 0.0;
  dVar24 = 0.0;
  dVar28 = 0.0;
  dVar32 = 0.0;
  dVar21 = 0.0;
  dVar26 = 0.0;
  dVar20 = 0.0;
  if (uVar9 != 0) {
    puVar1 = (this->m_unique_colors).m_p;
    uVar12 = 0;
    do {
      dVar30 = (double)puVar1[uVar12].m_weight;
      dVar25 = (double)puVar1[uVar12].m_color.field_0.field_0.r * dVar30;
      dVar27 = (double)puVar1[uVar12].m_color.field_0.field_0.g * dVar30;
      dVar29 = (double)puVar1[uVar12].m_color.field_0.field_0.b * dVar30;
      uVar17 = (ulong)(((this->m_best_solution).m_selectors.m_p[uVar12] ^ 1) << 2);
      dVar20 = dVar20 + (double)*(int *)((long)refine_solution::prods_0 + uVar17) * dVar30;
      dVar26 = dVar26 + (double)*(int *)((long)refine_solution::prods_1 + uVar17) * dVar30;
      dVar21 = dVar21 + (double)*(int *)((long)refine_solution::prods_2 + uVar17) * dVar30;
      dVar30 = (double)*(int *)((long)refine_solution::w1Tab + uVar17);
      dVar32 = dVar32 + dVar30 * dVar25;
      dVar28 = dVar28 + dVar30 * dVar27;
      dVar24 = dVar24 + dVar30 * dVar29;
      dVar23 = dVar23 + dVar25;
      dVar22 = dVar22 + dVar27;
      dVar19 = dVar19 + dVar29;
      uVar12 = uVar12 + 1;
    } while (uVar9 != uVar12);
  }
  if ((((dVar26 != 0.0) || (bVar2 = false, NAN(dVar26))) &&
      ((bVar2 = false, dVar21 != 0.0 || (NAN(dVar21))))) &&
     (dVar25 = dVar21 * dVar26 - dVar20 * dVar20, 1.249999968422344e-05 <= ABS(dVar25))) {
    dVar31 = -dVar32;
    dVar23 = dVar23 * 3.0 - dVar32;
    dVar29 = -dVar28;
    dVar22 = dVar22 * 3.0 - dVar28;
    dVar27 = -dVar24;
    dVar19 = dVar19 * 3.0 - dVar24;
    dVar25 = 0.364705890417099 / dVar25;
    dVar30 = dVar25 * 2.0322580337524414;
    uVar7 = (uint)((dVar32 * dVar26 - dVar20 * dVar23) * dVar25 + 0.5);
    if (0x1e < (int)uVar7) {
      uVar7 = 0x1f;
    }
    local_70 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      local_70 = 0;
    }
    if (refinement_level == 1) {
      local_58 = this;
      local_74 = (int)((dVar28 * dVar26 - dVar20 * dVar22) * dVar30 + 0.5);
      if (0x3e < local_74) {
        local_74 = 0x3f;
      }
      iVar14 = 0;
      if (local_74 < 1) {
        local_74 = iVar14;
      }
      local_78 = (int)((dVar24 * dVar26 - dVar20 * dVar19) * dVar25 + 0.5);
      if (0x1e < local_78) {
        local_78 = 0x1f;
      }
      if (local_78 < 1) {
        local_78 = iVar14;
      }
      iVar13 = (int)((dVar23 * dVar21 + dVar31 * dVar20) * dVar25 + 0.5);
      if (0x1e < iVar13) {
        iVar13 = 0x1f;
      }
      if (iVar13 < 1) {
        iVar13 = iVar14;
      }
      local_60 = CONCAT44(local_60._4_4_,iVar13);
      local_7c = (int)((dVar22 * dVar21 + dVar29 * dVar20) * dVar30 + 0.5);
      if (0x3e < local_7c) {
        local_7c = 0x3f;
      }
      if (local_7c < 1) {
        local_7c = iVar14;
      }
      local_80 = (int)((dVar19 * dVar21 + dVar27 * dVar20) * dVar25 + 0.5);
      if (0x1e < local_80) {
        local_80 = 0x1f;
      }
      if (local_80 < 1) {
        local_80 = 0;
      }
      bVar2 = false;
      lVar18 = 0;
      do {
        local_68 = CONCAT44(local_68._4_4_,0xffffffff);
        do {
          iVar14 = -1;
          do {
            iVar13 = -1;
            do {
              local_8c.field_0.g = (char)local_74;
              local_8c.field_0.r = (char)local_70;
              local_8c.field_0.a = 0;
              local_8c.field_0.b = (byte)local_78;
              local_88.field_0.r = (uchar)local_60;
              local_88.field_0.g = (uchar)local_7c;
              local_88.field_0.b = (uchar)local_80;
              local_88.field_0.a = '\0';
              uVar7 = (uint)local_8c.c[lVar18 * 4] + (int)local_68;
              if (0x1e < (int)uVar7) {
                uVar7 = 0x1f;
              }
              uVar9 = (ulong)uVar7;
              if ((int)uVar7 < 1) {
                uVar9 = 0;
              }
              local_84.m_low_color = 0;
              local_84.m_high_color = 0;
              local_8c.c[lVar18 * 4] = (uchar)uVar9;
              iVar15 = (uint)local_8c.c[lVar18 * 4 + 1] + iVar14;
              if (0x3e < iVar15) {
                iVar15 = 0x3f;
              }
              uVar3 = (uchar)iVar15;
              if (iVar15 < 1) {
                uVar3 = '\0';
              }
              local_8c.c[lVar18 * 4 + 1] = uVar3;
              iVar15 = (uint)local_8c.c[lVar18 * 4 + 2] + iVar13;
              if (0x1e < iVar15) {
                iVar15 = 0x1f;
              }
              uVar3 = (uchar)iVar15;
              if (iVar15 < 1) {
                uVar3 = '\0';
              }
              local_8c.c[lVar18 * 4 + 2] = uVar3;
              uVar5 = dxt1_block::pack_color((color_quad_u8 *)&local_8c.field_0,false,0x7f);
              local_84.m_low_color = uVar5;
              uVar6 = dxt1_block::pack_color((color_quad_u8 *)&local_88.field_0,false,0x7f);
              local_84.m_high_color = uVar6;
              if (uVar5 < uVar6) {
                local_84.m_high_color = uVar5;
                local_84.m_low_color = uVar6;
              }
              bVar4 = evaluate_solution(local_58,&local_84,false);
              bVar2 = (bool)(bVar2 | bVar4);
              iVar13 = iVar13 + 1;
            } while (iVar13 != 2);
            iVar14 = iVar14 + 1;
          } while (iVar14 != 2);
          iVar14 = (int)local_68 + 1;
          local_68 = CONCAT44(local_68._4_4_,iVar14);
        } while (iVar14 != 2);
        bVar4 = lVar18 == 0;
        lVar18 = lVar18 + 1;
      } while (bVar4);
    }
    else if (refinement_level == 0) {
      iVar14 = (int)((dVar28 * dVar26 - dVar20 * dVar22) * dVar30 + 0.5);
      if (0x3e < iVar14) {
        iVar14 = 0x3f;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      uVar7 = (uint)((dVar24 * dVar26 - dVar20 * dVar19) * dVar25 + 0.5);
      if (0x1e < (int)uVar7) {
        uVar7 = 0x1f;
      }
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      iVar13 = (int)((dVar23 * dVar21 + dVar31 * dVar20) * dVar25 + 0.5);
      uVar7 = uVar7 | (uint)local_70 << 0xb | iVar14 << 5;
      if (0x1e < iVar13) {
        iVar13 = 0x1f;
      }
      if (iVar13 < 1) {
        iVar13 = 0;
      }
      iVar15 = (int)((dVar22 * dVar21 + dVar29 * dVar20) * dVar30 + 0.5);
      iVar14 = 0x3f;
      if (iVar15 < 0x3f) {
        iVar14 = iVar15;
      }
      if (iVar14 < 1) {
        iVar14 = 0;
      }
      uVar16 = (uint)((dVar19 * dVar21 + dVar27 * dVar20) * dVar25 + 0.5);
      uVar11 = 0x1f;
      if ((int)uVar16 < 0x1f) {
        uVar11 = uVar16;
      }
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      uVar11 = uVar11 | iVar13 << 0xb | iVar14 << 5;
      uVar10 = (undefined2)uVar11;
      local_8c.m_u32._2_2_ = (undefined2)uVar7;
      local_8c.m_u32._0_2_ = uVar10;
      if (uVar11 < uVar7) {
        local_8c.m_u32._0_2_ = local_8c.m_u32._2_2_;
        local_8c.m_u32._2_2_ = uVar10;
      }
      bVar2 = evaluate_solution(this,(dxt1_solution_coordinates *)&local_8c.field_0,false);
    }
    else {
      uVar7 = (uint)((dVar28 * dVar26 - dVar20 * dVar22) * dVar30 + 0.5);
      if (0x3e < (int)uVar7) {
        uVar7 = 0x3f;
      }
      if ((int)uVar7 < 1) {
        uVar7 = 0;
      }
      uVar11 = (uint)((dVar24 * dVar26 - dVar20 * dVar19) * dVar25 + 0.5);
      if (0x1e < (int)uVar11) {
        uVar11 = 0x1f;
      }
      if ((int)uVar11 < 1) {
        uVar11 = 0;
      }
      local_7c = (int)((dVar23 * dVar21 + dVar31 * dVar20) * dVar25 + 0.5);
      if (0x1e < local_7c) {
        local_7c = 0x1f;
      }
      if (local_7c < 1) {
        local_7c = 0;
      }
      local_80 = (int)((dVar22 * dVar21 + dVar29 * dVar20) * dVar30 + 0.5);
      if (0x3e < local_80) {
        local_80 = 0x3f;
      }
      if (local_80 < 1) {
        local_80 = 0;
      }
      local_4c = (int)((dVar19 * dVar21 + dVar27 * dVar20) * dVar25 + 0.5);
      if (0x1e < local_4c) {
        local_4c = 0x1f;
      }
      if (local_4c < 1) {
        local_4c = 0;
      }
      local_70 = (ulong)((uint)local_70 & 0xff);
      local_40 = (ulong)(uVar7 & 0xff);
      local_60 = (ulong)(uVar11 & 0xff);
      local_48 = 0xffffffff;
      bVar2 = false;
      local_58 = this;
      do {
        local_78 = (int)local_48 + (int)local_70;
        if (0x1e < local_78) {
          local_78 = 0x1f;
        }
        if (local_78 < 1) {
          local_78 = 0;
        }
        local_38 = 0xffffffff;
        do {
          local_74 = (int)local_38 + (int)local_40;
          if (0x3e < local_74) {
            local_74 = 0x3f;
          }
          if (local_74 < 1) {
            local_74 = 0;
          }
          local_68 = 0xffffffff;
          do {
            local_84.m_low_color = 0;
            local_84.m_high_color = 0;
            local_88.field_0.r = (uchar)local_7c;
            local_88.field_0.g = (uchar)local_80;
            local_88.field_0.b = (uchar)local_4c;
            local_88.field_0.a = '\0';
            local_8c.field_0.g = (char)local_74;
            local_8c.field_0.r = (char)local_78;
            iVar14 = (int)local_60 + (int)local_68;
            if (0x1e < iVar14) {
              iVar14 = 0x1f;
            }
            local_8c.field_0.b = (uchar)iVar14;
            if (iVar14 < 1) {
              local_8c.field_0.b = 0;
            }
            local_8c.field_0.a = 0;
            iVar14 = -1;
            do {
              iVar13 = -1;
              do {
                iVar15 = -1;
                do {
                  iVar8 = (uint)local_88.field_0.r + iVar14;
                  if (0x1e < iVar8) {
                    iVar8 = 0x1f;
                  }
                  local_88.field_0.r = (uchar)iVar8;
                  if (iVar8 < 1) {
                    local_88.field_0.r = 0;
                  }
                  iVar8 = (uint)local_88.field_0.g + iVar13;
                  if (0x3e < iVar8) {
                    iVar8 = 0x3f;
                  }
                  local_88.field_0.g = (uchar)iVar8;
                  if (iVar8 < 1) {
                    local_88.field_0.g = 0;
                  }
                  iVar8 = (uint)local_88.field_0.b + iVar15;
                  if (0x1e < iVar8) {
                    iVar8 = 0x1f;
                  }
                  local_88.field_0.b = (uchar)iVar8;
                  if (iVar8 < 1) {
                    local_88.field_0.b = 0;
                  }
                  uVar5 = dxt1_block::pack_color((color_quad_u8 *)&local_8c.field_0,false,0x7f);
                  local_84.m_low_color = uVar5;
                  uVar6 = dxt1_block::pack_color((color_quad_u8 *)&local_88.field_0,false,0x7f);
                  local_84.m_high_color = uVar6;
                  if (uVar5 < uVar6) {
                    local_84.m_high_color = uVar5;
                    local_84.m_low_color = uVar6;
                  }
                  bVar4 = evaluate_solution(local_58,&local_84,false);
                  bVar2 = (bool)(bVar2 | bVar4);
                  iVar15 = iVar15 + 1;
                } while (iVar15 != 2);
                iVar13 = iVar13 + 1;
              } while (iVar13 != 2);
              iVar14 = iVar14 + 1;
            } while (iVar14 != 2);
            uVar7 = (int)local_68 + 1;
            local_68 = (ulong)uVar7;
          } while (uVar7 != 2);
          uVar7 = (int)local_38 + 1;
          local_38 = (ulong)uVar7;
        } while (uVar7 != 2);
        uVar7 = (int)local_48 + 1;
        local_48 = (ulong)uVar7;
      } while (uVar7 != 2);
    }
  }
  return bVar2;
}

Assistant:

bool dxt1_endpoint_optimizer::refine_solution(int refinement_level)
    {
        compute_selectors();

        static const int w1Tab[4] = { 3, 0, 2, 1 };

        static const int prods_0[4] = { 0x00, 0x00, 0x02, 0x02 };
        static const int prods_1[4] = { 0x00, 0x09, 0x01, 0x04 };
        static const int prods_2[4] = { 0x09, 0x00, 0x04, 0x01 };

        double akku_0 = 0;
        double akku_1 = 0;
        double akku_2 = 0;
        double At1_r, At1_g, At1_b;
        double At2_r, At2_g, At2_b;

        At1_r = At1_g = At1_b = 0;
        At2_r = At2_g = At2_b = 0;
        for (uint i = 0; i < m_unique_colors.size(); i++)
        {
            const color_quad_u8& c = m_unique_colors[i].m_color;
            const double weight = m_unique_colors[i].m_weight;

            double r = c.r * weight;
            double g = c.g * weight;
            double b = c.b * weight;
            int step = m_best_solution.m_selectors[i] ^ 1;

            int w1 = w1Tab[step];

            akku_0 += prods_0[step] * weight;
            akku_1 += prods_1[step] * weight;
            akku_2 += prods_2[step] * weight;
            At1_r += w1 * r;
            At1_g += w1 * g;
            At1_b += w1 * b;
            At2_r += r;
            At2_g += g;
            At2_b += b;
        }

        At2_r = 3 * At2_r - At1_r;
        At2_g = 3 * At2_g - At1_g;
        At2_b = 3 * At2_b - At1_b;

        double xx = akku_2;
        double yy = akku_1;
        double xy = akku_0;

        double t = xx * yy - xy * xy;
        if (!yy || !xx || (fabs(t) < .0000125f))
        {
            return false;
        }

        double frb = (3.0f * 31.0f / 255.0f) / t;
        double fg = frb * (63.0f / 31.0f);

        bool improved = false;

        if (refinement_level == 0)
        {
            uint max16;
            max16 = math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31) << 11;
            max16 |= math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63) << 5;
            max16 |= math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31) << 0;

            uint min16;
            min16 = math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31) << 11;
            min16 |= math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63) << 5;
            min16 |= math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31) << 0;

            dxt1_solution_coordinates nc((uint16)min16, (uint16)max16);
            nc.canonicalize();
            improved |= evaluate_solution(nc);
        }
        else if (refinement_level == 1)
        {
            // Try exploring the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];

            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (uint i = 0; i < 2; i++)
            {
                for (int rr = -1; rr <= 1; rr++)
                {
                    for (int gr = -1; gr <= 1; gr++)
                    {
                        for (int br = -1; br <= 1; br++)
                        {
                            dxt1_solution_coordinates nc;

                            color_quad_u8 c[2];
                            c[0] = e[0];
                            c[1] = e[1];

                            c[i][0] = (uint8)math::clamp<int>(c[i][0] + rr, 0, 31);
                            c[i][1] = (uint8)math::clamp<int>(c[i][1] + gr, 0, 63);
                            c[i][2] = (uint8)math::clamp<int>(c[i][2] + br, 0, 31);

                            nc.m_low_color = dxt1_block::pack_color(c[0], false);
                            nc.m_high_color = dxt1_block::pack_color(c[1], false);

                            nc.canonicalize();
                            improved |= evaluate_solution(nc);
                        }
                    }
                }
            }
        }
        else
        {
            // Try even harder to explore the local lattice neighbors of the least squares optimized result.
            color_quad_u8 e[2];
            e[0].clear();
            e[0][0] = (uint8)math::clamp<int>(static_cast<int>((At1_r * yy - At2_r * xy) * frb + 0.5f), 0, 31);
            e[0][1] = (uint8)math::clamp<int>(static_cast<int>((At1_g * yy - At2_g * xy) * fg + 0.5f), 0, 63);
            e[0][2] = (uint8)math::clamp<int>(static_cast<int>((At1_b * yy - At2_b * xy) * frb + 0.5f), 0, 31);

            e[1].clear();
            e[1][0] = (uint8)math::clamp<int>(static_cast<int>((At2_r * xx - At1_r * xy) * frb + 0.5f), 0, 31);
            e[1][1] = (uint8)math::clamp<int>(static_cast<int>((At2_g * xx - At1_g * xy) * fg + 0.5f), 0, 63);
            e[1][2] = (uint8)math::clamp<int>(static_cast<int>((At2_b * xx - At1_b * xy) * frb + 0.5f), 0, 31);

            for (int orr = -1; orr <= 1; orr++)
            {
                for (int ogr = -1; ogr <= 1; ogr++)
                {
                    for (int obr = -1; obr <= 1; obr++)
                    {
                        dxt1_solution_coordinates nc;

                        color_quad_u8 c[2];
                        c[0] = e[0];
                        c[1] = e[1];

                        c[0][0] = (uint8)math::clamp<int>(c[0][0] + orr, 0, 31);
                        c[0][1] = (uint8)math::clamp<int>(c[0][1] + ogr, 0, 63);
                        c[0][2] = (uint8)math::clamp<int>(c[0][2] + obr, 0, 31);

                        for (int rr = -1; rr <= 1; rr++)
                        {
                            for (int gr = -1; gr <= 1; gr++)
                            {
                                for (int br = -1; br <= 1; br++)
                                {
                                    c[1][0] = (uint8)math::clamp<int>(c[1][0] + rr, 0, 31);
                                    c[1][1] = (uint8)math::clamp<int>(c[1][1] + gr, 0, 63);
                                    c[1][2] = (uint8)math::clamp<int>(c[1][2] + br, 0, 31);

                                    nc.m_low_color = dxt1_block::pack_color(c[0], false);
                                    nc.m_high_color = dxt1_block::pack_color(c[1], false);
                                    nc.canonicalize();

                                    improved |= evaluate_solution(nc);
                                }
                            }
                        }
                    }
                }
            }
        }

        return improved;
    }